

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

void __thiscall RTQuaternion::fromEuler(RTQuaternion *this,RTVector3 *vec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = cosf(vec->m_data[0] * 0.5);
  fVar2 = sinf(vec->m_data[0] * 0.5);
  fVar3 = cosf(vec->m_data[1] * 0.5);
  fVar4 = sinf(vec->m_data[1] * 0.5);
  fVar5 = cosf(vec->m_data[2] * 0.5);
  fVar6 = sinf(vec->m_data[2] * 0.5);
  this->m_data[0] = fVar5 * fVar1 * fVar3 + fVar6 * fVar2 * fVar4;
  this->m_data[1] = fVar5 * fVar3 * fVar2 + fVar6 * -(fVar4 * fVar1);
  this->m_data[2] = fVar5 * fVar4 * fVar1 + fVar6 * fVar3 * fVar2;
  this->m_data[3] = fVar6 * fVar1 * fVar3 + -(fVar2 * fVar4) * fVar5;
  normalize(this);
  return;
}

Assistant:

void RTQuaternion::fromEuler(RTVector3& vec)
{
    RTFLOAT cosX2 = cos(vec.x() / 2.0f);
    RTFLOAT sinX2 = sin(vec.x() / 2.0f);
    RTFLOAT cosY2 = cos(vec.y() / 2.0f);
    RTFLOAT sinY2 = sin(vec.y() / 2.0f);
    RTFLOAT cosZ2 = cos(vec.z() / 2.0f);
    RTFLOAT sinZ2 = sin(vec.z() / 2.0f);

    m_data[0] = cosX2 * cosY2 * cosZ2 + sinX2 * sinY2 * sinZ2;
    m_data[1] = sinX2 * cosY2 * cosZ2 - cosX2 * sinY2 * sinZ2;
    m_data[2] = cosX2 * sinY2 * cosZ2 + sinX2 * cosY2 * sinZ2;
    m_data[3] = cosX2 * cosY2 * sinZ2 - sinX2 * sinY2 * cosZ2;
    normalize();
}